

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

bool processCmd(string *cmd)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  ostream *poVar5;
  string *psVar6;
  bool bVar7;
  string *local_380;
  exception *e_2;
  exception *e_1;
  string sourcePath_1;
  exception *e;
  undefined1 local_1a0 [8];
  path p;
  string sourcePath;
  undefined1 local_158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  allocator local_138;
  allocator local_137;
  allocator local_136;
  allocator local_135 [20];
  allocator local_121;
  string *local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  string *cmd_local;
  
  x.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  local_120 = local_118;
  local_18 = cmd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"put",&local_121);
  local_120 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"read",local_135);
  local_120 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"mkdir",&local_136);
  local_120 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"put2",&local_137);
  local_120 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"read2",&local_138);
  local_120 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"quit",
             (allocator *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_120 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"fetch",
             (allocator *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_120 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"fetch2",
             (allocator *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  x.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_137);
  std::allocator<char>::~allocator((allocator<char> *)&local_136);
  std::allocator<char>::~allocator((allocator<char> *)local_135);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_158,local_18,' ');
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_158,0);
  iVar2 = std::__cxx11::string::compare((string *)pvVar3);
  if (iVar2 == 0) {
    type = put;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_158);
    if (sVar4 != 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: put source_file_path");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      cmd_local._7_1_ = 0;
      goto LAB_00112a0b;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_158,1);
    std::__cxx11::string::string((string *)&p.field_0x18,(string *)pvVar3);
    std::ifstream::open((string *)ifs,(int)&p + (_S_out|_S_in));
    bVar1 = std::ifstream::is_open();
    bVar7 = (bVar1 & 1) != 0;
    if (bVar7) {
      boost::filesystem::path::path((path *)local_1a0,(string_type *)&p.field_0x18);
      boost::filesystem::path::filename();
      psVar6 = boost::filesystem::path::string_abi_cxx11_((path *)&e);
      std::__cxx11::string::operator+=((string *)desFileName_abi_cxx11_,(string *)psVar6);
      boost::filesystem::path::~path((path *)&e);
      boost::filesystem::path::~path((path *)local_1a0);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error: the input file does not exist");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      cmd_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)&p.field_0x18);
joined_r0x0011253d:
    if (!bVar7) goto LAB_00112a0b;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_158,0);
    iVar2 = std::__cxx11::string::compare((string *)pvVar3);
    if (iVar2 == 0) {
      type = read;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_158);
      if (sVar4 != 4) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: read file_id offset count");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        cmd_local._7_1_ = 0;
        goto LAB_00112a0b;
      }
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,1);
      read_fileId = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,2);
      read_offset = std::__cxx11::stoll(pvVar3,(size_t *)0x0,10);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,3);
      read_count = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,0);
      iVar2 = std::__cxx11::string::compare((string *)pvVar3);
      if (iVar2 == 0) {
        type = mkdir;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_158);
        if (sVar4 != 2) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: mkdir folder");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          cmd_local._7_1_ = 0;
          goto LAB_00112a0b;
        }
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158,1);
        std::__cxx11::string::operator=((string *)mkdir_path_abi_cxx11_,(string *)pvVar3);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158,0);
        iVar2 = std::__cxx11::string::compare((string *)pvVar3);
        if (iVar2 == 0) {
          type = put2;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_158);
          if (sVar4 != 3) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "Usage: put2 source_file_path des_file_folder");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            cmd_local._7_1_ = 0;
            goto LAB_00112a0b;
          }
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,1);
          std::__cxx11::string::string((string *)&e_1,(string *)pvVar3);
          std::ifstream::open((string *)ifs,(_Ios_Openmode)&e_1);
          bVar1 = std::ifstream::is_open();
          bVar7 = (bVar1 & 1) != 0;
          if (bVar7) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_158,2);
            std::__cxx11::string::operator=((string *)desFileName_abi_cxx11_,(string *)pvVar3);
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Error: the input file does not exist");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            cmd_local._7_1_ = 0;
          }
          std::__cxx11::string::~string((string *)&e_1);
          goto joined_r0x0011253d;
        }
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158,0);
        iVar2 = std::__cxx11::string::compare((string *)pvVar3);
        if (iVar2 == 0) {
          type = read2;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_158);
          if (sVar4 != 4) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: read2 file_path offset count");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            cmd_local._7_1_ = 0;
            goto LAB_00112a0b;
          }
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,1);
          std::__cxx11::string::operator=((string *)read_filename_abi_cxx11_,(string *)pvVar3);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,2);
          read_offset = std::__cxx11::stoll(pvVar3,(size_t *)0x0,10);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,3);
          read_count = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,0);
          iVar2 = std::__cxx11::string::compare((string *)pvVar3);
          if (iVar2 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Bye: Exit miniDFS");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            exit(0);
          }
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_158,0);
          iVar2 = std::__cxx11::string::compare((string *)pvVar3);
          if (iVar2 == 0) {
            type = fetch;
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_158);
            if (sVar4 != 3) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: fetch file_id save_path");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              cmd_local._7_1_ = 0;
              goto LAB_00112a0b;
            }
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_158,1);
            fetch_id = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_158,2);
            std::__cxx11::string::operator=((string *)fetch_savepath_abi_cxx11_,(string *)pvVar3);
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_158,0);
            iVar2 = std::__cxx11::string::compare((string *)pvVar3);
            if (iVar2 == 0) {
              type = fetch2;
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_158);
              if (sVar4 != 3) {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: fetch2 file_path save_path");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                cmd_local._7_1_ = 0;
                goto LAB_00112a0b;
              }
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_158,1);
              std::__cxx11::string::operator=((string *)fetch_filepath_abi_cxx11_,(string *)pvVar3);
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_158,2);
              std::__cxx11::string::operator=((string *)fetch_savepath_abi_cxx11_,(string *)pvVar3);
            }
          }
        }
      }
    }
  }
  cmd_local._7_1_ = 1;
LAB_00112a0b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  local_380 = (string *)&local_18;
  do {
    local_380 = local_380 + -0x20;
    std::__cxx11::string::~string(local_380);
  } while (local_380 != local_118);
  return (bool)(cmd_local._7_1_ & 1);
}

Assistant:

bool processCmd(const string& cmd)
{
    string possibleCmds[] = {"put", "read", "mkdir", "put2", "read2", "quit", "fetch", "fetch2"};

    vector<string> x = split(cmd, ' ');
    if (x[0].compare(possibleCmds[0]) == 0)
    {
        type = MsgType::put;
        if (x.size() != 2)
        {
            cerr << "Usage: put source_file_path" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        boost::filesystem::path p(sourcePath);

        desFileName += p.filename().string();

    }
    else if (x[0].compare(possibleCmds[1]) == 0)
    {
        type = MsgType::read;
        if (x.size() != 4)
        {
            cerr << "Usage: read file_id offset count" << endl;
            return false;
        }

        try {
            read_fileId = stoi(x[1]);
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: id, offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if(x[0].compare(possibleCmds[2]) == 0){
        type = MsgType::mkdir;
        if (x.size() != 2)
        {
            cerr << "Usage: mkdir folder" << endl;
            return false;
        }
        mkdir_path = x[1];

    }
    else if(x[0].compare(possibleCmds[3]) == 0)
    {
        type = MsgType::put2;
        if (x.size() != 3)
        {
            cerr << "Usage: put2 source_file_path des_file_folder" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        desFileName = x[2];

    }
    else if (x[0].compare(possibleCmds[4]) == 0)
    {
        type = MsgType::read2;
        if (x.size() != 4)
        {
            cerr << "Usage: read2 file_path offset count" << endl;
            return false;
        }

        read_filename = x[1];

        try {
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[5]) == 0)
    {
        cout << "Bye: Exit miniDFS" << endl;
        exit(0);
    }
    else if (x[0].compare(possibleCmds[6]) == 0)
    {
        type = MsgType::fetch;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch file_id save_path" << endl;
            return false;
        }

        try {
            fetch_id = stoi(x[1]);
            fetch_savepath = x[2];
        }
        catch (exception& e)
        {
            std::cout << "Error: id isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[7]) == 0)
    {
        type = MsgType::fetch2;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch2 file_path save_path" << endl;
            return false;
        }

        fetch_filepath = x[1];
        fetch_savepath = x[2];
    }

    return true;
}